

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

void __thiscall lunasvg::parseInlineStyle(lunasvg *this,string_view input,SVGElement *element)

{
  bool bVar1;
  bool bVar2;
  const_reference pvVar3;
  string_view sVar4;
  string_view local_88;
  PropertyID local_71;
  undefined1 local_70 [7];
  PropertyID id;
  string value;
  undefined1 local_40 [8];
  string name;
  SVGElement *element_local;
  string_view input_local;
  
  name.field_2._8_8_ = input._M_str;
  input_local._M_len = input._M_len;
  element_local = (SVGElement *)this;
  std::__cxx11::string::string((string *)local_40);
  skipOptionalSpaces((string_view *)&element_local);
  do {
    bVar1 = readCSSIdentifier((string_view *)&element_local,(string *)local_40);
    if (!bVar1) {
      value.field_2._8_4_ = 0;
LAB_0013e89b:
      std::__cxx11::string::~string((string *)local_40);
      return;
    }
    skipOptionalSpaces((string_view *)&element_local);
    bVar1 = skipDelimiter((string_view *)&element_local,':');
    if (!bVar1) {
      value.field_2._8_4_ = 1;
      goto LAB_0013e89b;
    }
    std::__cxx11::string::string((string *)local_70);
    while( true ) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&element_local);
      bVar1 = false;
      if (!bVar2) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)&element_local);
        bVar1 = *pvVar3 != ';';
      }
      if (!bVar1) break;
      std::basic_string_view<char,_std::char_traits<char>_>::front
                ((basic_string_view<char,_std::char_traits<char>_> *)&element_local);
      std::__cxx11::string::push_back((char)local_70);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&element_local,1);
    }
    sVar4 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
    local_88 = sVar4;
    local_71 = csspropertyid(&local_88);
    if (local_71 != Unknown) {
      SVGElement::setAttribute((SVGElement *)name.field_2._8_8_,0x100,local_71,(string *)local_70);
    }
    skipOptionalSpacesOrDelimiter((string_view *)&element_local,';');
    std::__cxx11::string::~string((string *)local_70);
  } while( true );
}

Assistant:

inline void parseInlineStyle(std::string_view input, SVGElement* element)
{
    std::string name;
    skipOptionalSpaces(input);
    while(readCSSIdentifier(input, name)) {
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, ':'))
            return;
        std::string value;
        while(!input.empty() && input.front() != ';') {
            value.push_back(input.front());
            input.remove_prefix(1);
        }

        auto id = csspropertyid(name);
        if(id != PropertyID::Unknown)
            element->setAttribute(0x100, id, value);
        skipOptionalSpacesOrDelimiter(input, ';');
    }
}